

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

void xmlDumpElementContent(xmlBufferPtr buf,xmlElementContentPtr content)

{
  xmlElementContentType xVar1;
  _xmlElementContent *p_Var2;
  _xmlElementContent *cur;
  _xmlElementContent **pp_Var3;
  char *string;
  bool bVar4;
  
  if (content != (xmlElementContentPtr)0x0) {
    xmlBufferWriteChar(buf,"(");
    cur = content;
    while (cur != (xmlElementContentPtr)0x0) {
      xVar1 = cur->type;
      if (xVar1 - XML_ELEMENT_CONTENT_SEQ < 2) {
        if (((cur != content) && (cur->parent != (_xmlElementContent *)0x0)) &&
           ((xVar1 != cur->parent->type || (cur->ocur != XML_ELEMENT_CONTENT_ONCE)))) {
          xmlBufferWriteChar(buf,"(");
        }
        pp_Var3 = &cur->c1;
      }
      else {
        if (xVar1 == XML_ELEMENT_CONTENT_ELEMENT) {
          if (cur->prefix != (xmlChar *)0x0) {
            xmlBufferWriteCHAR(buf,cur->prefix);
            xmlBufferWriteChar(buf,":");
          }
          xmlBufferWriteCHAR(buf,cur->name);
        }
        else if (xVar1 == XML_ELEMENT_CONTENT_PCDATA) {
          xmlBufferWriteChar(buf,"#PCDATA");
        }
        else {
          xmlErrValid((xmlValidCtxtPtr)0x0,XML_ERR_INTERNAL_ERROR,
                      "Internal: ELEMENT cur corrupted invalid type\n",(char *)0x0);
        }
        do {
          if (cur == content) goto LAB_00189f9f;
          p_Var2 = cur->parent;
          if (p_Var2 == (_xmlElementContent *)0x0) {
            return;
          }
          if ((cur->type - XML_ELEMENT_CONTENT_SEQ < 2) &&
             ((cur->type != p_Var2->type || (cur->ocur != XML_ELEMENT_CONTENT_ONCE)))) {
            xmlBufferWriteChar(buf,")");
          }
          xmlDumpElementOccur(buf,cur);
          bVar4 = cur != p_Var2->c1;
          cur = p_Var2;
        } while (bVar4);
        string = " , ";
        if (p_Var2->type == XML_ELEMENT_CONTENT_SEQ) {
LAB_00189f90:
          xmlBufferWriteChar(buf,string);
        }
        else if (p_Var2->type == XML_ELEMENT_CONTENT_OR) {
          string = " | ";
          goto LAB_00189f90;
        }
        pp_Var3 = &p_Var2->c2;
      }
      cur = *pp_Var3;
LAB_00189f9f:
      if (cur == content) {
        xmlBufferWriteChar(buf,")");
        xmlDumpElementOccur(buf,content);
        return;
      }
    }
  }
  return;
}

Assistant:

static void
xmlDumpElementContent(xmlBufferPtr buf, xmlElementContentPtr content) {
    xmlElementContentPtr cur;

    if (content == NULL) return;

    xmlBufferWriteChar(buf, "(");
    cur = content;

    do {
        if (cur == NULL) return;

        switch (cur->type) {
            case XML_ELEMENT_CONTENT_PCDATA:
                xmlBufferWriteChar(buf, "#PCDATA");
                break;
            case XML_ELEMENT_CONTENT_ELEMENT:
                if (cur->prefix != NULL) {
                    xmlBufferWriteCHAR(buf, cur->prefix);
                    xmlBufferWriteChar(buf, ":");
                }
                xmlBufferWriteCHAR(buf, cur->name);
                break;
            case XML_ELEMENT_CONTENT_SEQ:
            case XML_ELEMENT_CONTENT_OR:
                if ((cur != content) &&
                    (cur->parent != NULL) &&
                    ((cur->type != cur->parent->type) ||
                     (cur->ocur != XML_ELEMENT_CONTENT_ONCE)))
                    xmlBufferWriteChar(buf, "(");
                cur = cur->c1;
                continue;
            default:
                xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
                        "Internal: ELEMENT cur corrupted invalid type\n",
                        NULL);
        }

        while (cur != content) {
            xmlElementContentPtr parent = cur->parent;

            if (parent == NULL) return;

            if (((cur->type == XML_ELEMENT_CONTENT_OR) ||
                 (cur->type == XML_ELEMENT_CONTENT_SEQ)) &&
                ((cur->type != parent->type) ||
                 (cur->ocur != XML_ELEMENT_CONTENT_ONCE)))
                xmlBufferWriteChar(buf, ")");
            xmlDumpElementOccur(buf, cur);

            if (cur == parent->c1) {
                if (parent->type == XML_ELEMENT_CONTENT_SEQ)
                    xmlBufferWriteChar(buf, " , ");
                else if (parent->type == XML_ELEMENT_CONTENT_OR)
                    xmlBufferWriteChar(buf, " | ");

                cur = parent->c2;
                break;
            }

            cur = parent;
        }
    } while (cur != content);

    xmlBufferWriteChar(buf, ")");
    xmlDumpElementOccur(buf, content);
}